

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.h
# Opt level: O0

void __thiscall crnlib::unique_color::unique_color(unique_color *this,unique_color *param_1)

{
  unique_color *param_1_local;
  unique_color *this_local;
  
  color_quad<unsigned_char,_int>::color_quad(&this->m_color,&param_1->m_color);
  this->m_weight = param_1->m_weight;
  return;
}

Assistant:

struct CRN_EXPORT unique_color
    {
        inline unique_color()
        {
        }
        inline unique_color(const color_quad_u8& color, uint weight) :
            m_color(color),
            m_weight(weight)
        {
        }

        color_quad_u8 m_color;
        uint m_weight;

        inline bool operator<(const unique_color& c) const
        {
            return *reinterpret_cast<const uint32*>(&m_color) < *reinterpret_cast<const uint32*>(&c.m_color);
        }

        inline bool operator==(const unique_color& c) const
        {
            return *reinterpret_cast<const uint32*>(&m_color) == *reinterpret_cast<const uint32*>(&c.m_color);
        }
    }